

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_AddItemToArray(cJSON *array,cJSON *item)

{
  bool bVar1;
  cJSON *local_20;
  cJSON *c;
  cJSON *item_local;
  cJSON *array_local;
  
  local_20 = array->child;
  if (item != (cJSON *)0x0) {
    if (local_20 == (cJSON *)0x0) {
      array->child = item;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (local_20 != (cJSON *)0x0) {
          bVar1 = local_20->next != (cJSON *)0x0;
        }
        if (!bVar1) break;
        local_20 = local_20->next;
      }
      suffix_object(local_20,item);
    }
  }
  return;
}

Assistant:

void
cJSON_AddItemToArray(cJSON *array, cJSON *item)
{
    cJSON *c = array->child;
    if (!item)
        return;
    if (!c) {
        array->child = item;
    } else {
        while (c && c->next)
            c = c->next;
        suffix_object(c, item);
    }
}